

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O2

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this,string *name,string *length)

{
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)this,"",&local_31);
  std::__cxx11::string::string((string *)&this->Checksum,"",&local_32);
  std::__cxx11::string::string((string *)&this->Length,(string *)length);
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  std::__cxx11::string::string((string *)&this->Species,"",&local_33);
  std::__cxx11::string::string((string *)&this->URI,"",&local_34);
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SamSequence::SamSequence(const std::string& name,
                         const std::string& length)
    : AssemblyID("")
    , Checksum("")
    , Length(length)
    , Name(name)
    , Species("")
    , URI("")
{ }